

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

precise_unit __thiscall units::precise_unit::operator/(precise_unit *this,precise_unit *other)

{
  precise_unit pVar1;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double dVar2;
  double dVar3;
  uint local_4c;
  uint local_48;
  uint local_44;
  unit_data local_24;
  precise_unit *local_20;
  unit_data *in_stack_fffffffffffffff0;
  unit_data *in_stack_fffffffffffffff8;
  
  local_20 = in_RSI;
  dVar2 = multiplier(in_RDI);
  dVar3 = multiplier(local_20);
  local_24 = units::detail::unit_data::operator/
                       (in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  if (in_RDI->commodity_ == 0) {
    if (local_20->commodity_ == 0) {
      local_44 = 0;
    }
    else {
      local_44 = local_20->commodity_ ^ 0xffffffff;
    }
    local_48 = local_44;
  }
  else {
    if (local_20->commodity_ == 0) {
      local_4c = in_RDI->commodity_;
    }
    else {
      local_4c = in_RDI->commodity_ & (local_20->commodity_ ^ 0xffffffff);
    }
    local_48 = local_4c;
  }
  precise_unit((precise_unit *)&stack0xfffffffffffffff0,dVar2 / dVar3,&local_24,local_48);
  pVar1._8_8_ = in_stack_fffffffffffffff8;
  pVar1.multiplier_ = (double)in_stack_fffffffffffffff0;
  return pVar1;
}

Assistant:

constexpr precise_unit operator/(const precise_unit& other) const
    {
        return {
            multiplier() / other.multiplier(),
            base_units_ / other.base_units_,
            (commodity_ == 0) ?
                ((other.commodity_ == 0) ? 0 : ~other.commodity_) :
                ((other.commodity_ == 0) ? commodity_ :
                                           commodity_ & (~other.commodity_)),
        };
    }